

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O1

void __thiscall sjtu::UserManager::modify_profile(UserManager *this,int argc,string *argv)

{
  string *psVar1;
  uint uVar2;
  uint uVar3;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar4;
  UserManager *pUVar5;
  int iVar6;
  int *piVar7;
  undefined4 extraout_var;
  char *pcVar8;
  size_t sVar9;
  long *plVar10;
  undefined8 uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  string *psVar15;
  long lVar16;
  ulong uVar17;
  string *psVar18;
  bool bVar19;
  pair<long,_bool> pVar20;
  string curname;
  string usname;
  string umail;
  string uname;
  string uspass;
  long local_150;
  char *local_140;
  char local_138;
  undefined1 *local_130;
  size_t local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  undefined1 *local_110;
  size_t local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  ulong local_90;
  char local_88;
  UserManager *local_80;
  long *local_78;
  long local_70;
  long local_68 [2];
  long *local_58;
  long local_50;
  long local_48 [2];
  ulong local_38;
  undefined4 extraout_var_00;
  
  local_110 = &local_100;
  local_108 = 0;
  local_100 = 0;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"");
  local_130 = &local_120;
  local_128 = 0;
  local_120 = 0;
  local_80 = this;
  if (argc < 1) {
    local_150._0_4_ = -1;
  }
  else {
    psVar18 = argv + 1;
    local_150 = 0xffffffff;
    iVar13 = 0;
    do {
      psVar1 = psVar18 + -1;
      iVar6 = std::__cxx11::string::compare((char *)psVar1);
      psVar15 = (string *)&local_110;
      if (iVar6 == 0) {
LAB_0010655d:
        std::__cxx11::string::_M_assign(psVar15);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)psVar1);
        psVar15 = (string *)local_b0;
        if (iVar6 == 0) goto LAB_0010655d;
        iVar6 = std::__cxx11::string::compare((char *)psVar1);
        psVar15 = (string *)local_d0;
        if (iVar6 == 0) goto LAB_0010655d;
        iVar6 = std::__cxx11::string::compare((char *)psVar1);
        psVar15 = (string *)local_f0;
        if (iVar6 == 0) goto LAB_0010655d;
        iVar6 = std::__cxx11::string::compare((char *)psVar1);
        psVar15 = (string *)&local_130;
        if (iVar6 == 0) goto LAB_0010655d;
        iVar6 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar6 == 0) {
          pcVar8 = (psVar18->_M_dataplus)._M_p;
          piVar7 = __errno_location();
          iVar6 = *piVar7;
          *piVar7 = 0;
          local_150 = strtol(pcVar8,&local_140,10);
          if (local_140 == pcVar8) {
LAB_00106adf:
            uVar11 = std::__throw_invalid_argument("stoi");
            if (local_130 != &local_120) {
              operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
            }
            if (local_f0[0] != local_e0) {
              operator_delete(local_f0[0],local_e0[0] + 1);
            }
            if (local_d0[0] != local_c0) {
              operator_delete(local_d0[0],local_c0[0] + 1);
            }
            if (local_b0[0] != local_a0) {
              operator_delete(local_b0[0],local_a0[0] + 1);
            }
            if (local_110 != &local_100) {
              operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
            }
            _Unwind_Resume(uVar11);
          }
          if (((int)local_150 != local_150) || (*piVar7 == 0x22)) {
            std::__throw_out_of_range("stoi");
            goto LAB_00106adf;
          }
          if (*piVar7 == 0) {
            *piVar7 = iVar6;
          }
        }
      }
      psVar18 = psVar18 + 2;
      iVar13 = iVar13 + 2;
    } while (iVar13 < argc);
  }
  pUVar5 = local_80;
  pBVar4 = local_80->UserBpTree;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_130,local_130 + local_128);
  if (local_50 == 0) {
    local_90 = 0;
  }
  else {
    lVar16 = 0;
    lVar12 = 0;
    uVar14 = 0;
    do {
      uVar17 = (ulong)((int)*(char *)((long)local_58 + lVar16) + 0x100);
      lVar12 = (long)(lVar12 * 0x239 + uVar17) % 0x3b800001;
      uVar14 = (long)(uVar14 * 0x301 + uVar17) % 0x3b9aca07;
      lVar16 = lVar16 + 1;
    } while (local_50 != lVar16);
    local_90 = lVar12 << 0x20 | uVar14;
  }
  pVar20 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (pBVar4,&local_90);
  local_140 = (char *)pVar20.first;
  local_138 = pVar20.second;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  pBVar4 = pUVar5->UserBpTree;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_110,local_110 + local_108);
  if (local_70 == 0) {
    local_38 = 0;
  }
  else {
    lVar16 = 0;
    lVar12 = 0;
    local_38 = 0;
    do {
      uVar14 = (ulong)((int)*(char *)((long)local_78 + lVar16) + 0x100);
      lVar12 = (long)(lVar12 * 0x239 + uVar14) % 0x3b800001;
      local_38 = (long)(local_38 * 0x301 + uVar14) % 0x3b9aca07;
      lVar16 = lVar16 + 1;
    } while (local_70 != lVar16);
    local_38 = lVar12 << 0x20 | local_38;
  }
  pVar20 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (pBVar4,&local_38);
  local_90 = pVar20.first;
  local_88 = pVar20.second;
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if ((local_138 != '\x01') || (local_88 != '\x01')) {
    plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    goto LAB_00106a23;
  }
  iVar6 = (*(pUVar5->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                    (pUVar5->UserFile,&local_140);
  iVar13 = *(int *)(CONCAT44(extraout_var,iVar6) + 0x68);
  uVar2 = *(uint *)(CONCAT44(extraout_var,iVar6) + 0x6c);
  uVar3 = pUVar5->online_flag;
  bVar19 = uVar2 == uVar3;
  iVar6 = (*(pUVar5->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                    (pUVar5->UserFile,&local_90);
  pcVar8 = (char *)CONCAT44(extraout_var_00,iVar6);
  if (*(int *)(pcVar8 + 0x68) < iVar13) {
    if (uVar2 != uVar3) goto LAB_00106917;
LAB_00106860:
    if (iVar13 <= (int)local_150) goto LAB_00106917;
    iVar13 = std::__cxx11::string::compare((char *)local_b0);
    if (iVar13 != 0) {
      strcpy(pcVar8 + 0x15,(char *)local_b0[0]);
    }
    iVar13 = std::__cxx11::string::compare((char *)local_d0);
    if (iVar13 != 0) {
      strcpy(pcVar8 + 0x34,(char *)local_d0[0]);
    }
    iVar13 = std::__cxx11::string::compare((char *)local_f0);
    if (iVar13 != 0) {
      strcpy(pcVar8 + 0x49,(char *)local_f0[0]);
    }
    if ((int)local_150 != -1) {
      *(int *)(pcVar8 + 0x68) = (int)local_150;
    }
    (*(pUVar5->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])
              (pUVar5->UserFile,pcVar8 + 0x78);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1251a0);
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    sVar9 = strlen(pcVar8 + 0x34);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8 + 0x34,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    sVar9 = strlen(pcVar8 + 0x49);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8 + 0x49,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,*(int *)(pcVar8 + 0x68));
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  }
  else {
    if (local_128 == local_108) {
      if (local_128 != 0) {
        iVar6 = bcmp(local_130,local_110,local_128);
        bVar19 = iVar6 == 0 && uVar2 == uVar3;
      }
    }
    else {
      bVar19 = false;
    }
    if (bVar19) goto LAB_00106860;
LAB_00106917:
    plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  }
  std::ostream::put((char)plVar10);
  std::ostream::flush();
LAB_00106a23:
  if (local_130 != &local_120) {
    operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
  }
  return;
}

Assistant:

void modify_profile(int argc, std::string *argv) {
            std::string usname, uspass = "", uname = "", umail = "", curname;
            int upri = -1;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") usname = argv[i + 1];
                else if (argv[i] == "-p") uspass = argv[i + 1];
                else if (argv[i] == "-n") uname = argv[i + 1];
                else if (argv[i] == "-m") umail = argv[i + 1];
                else if (argv[i] == "-c") curname = argv[i + 1];
                else if (argv[i] == "-g") upri = stoi(argv[i + 1]);
            }
            std::pair<locType, bool> tmp1 = UserBpTree->find(hasher(curname));
            std::pair<locType, bool> tmp2 = UserBpTree->find(hasher(usname));
            if (tmp1.second == true && tmp2.second == true) {
                userType *cur = UserFile->read(tmp1.first);
                int cur_privilege = cur->privilege;
                bool cur_is_online = cur->is_online == online_flag;
                userType *user = UserFile->read(tmp2.first);
                if ((cur_privilege > user->privilege || curname == usname) && cur_is_online == true &&
                    cur_privilege > upri) {
                    if (uspass != "") strcpy(user->password, uspass.c_str());
                    if (uname != "") strcpy(user->name, uname.c_str());;
                    if (umail != "") strcpy(user->mailAddr, umail.c_str());;
                    if (upri != -1) user->privilege = upri;
                    UserFile->save(user->offset);
                    std::cout << user->username << " " << user->name << " " << user->mailAddr << " " << user->privilege
                              << std::endl;
                } else std::cout << -1 << std::endl;
            } else std::cout << -1 << std::endl;
        }